

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptNativeIntArray::DirectGetItemAtFull
          (JavascriptNativeIntArray *this,uint32 index,Var *outVal)

{
  PropertyQueryFlags PVar1;
  BOOL BVar2;
  ScriptContext *requestContext;
  RecyclableObject *propertyObject;
  undefined4 in_register_00000034;
  Var originalInstance;
  ScriptContext *in_R8;
  
  originalInstance = (Var)CONCAT44(in_register_00000034,index);
  requestContext =
       Js::Type::GetScriptContext
                 ((this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                  super_DynamicObject.super_RecyclableObject.type.ptr);
  PVar1 = GetItemQuery(this,originalInstance,index,outVal,in_R8);
  if (PVar1 == Property_Found) {
    return 1;
  }
  propertyObject = RecyclableObject::GetPrototype((RecyclableObject *)this);
  BVar2 = JavascriptOperators::GetItem(this,propertyObject,index,outVal,requestContext);
  return BVar2;
}

Assistant:

BOOL JavascriptNativeIntArray::DirectGetItemAtFull(uint32 index, Var* outVal)
    {
        ScriptContext* requestContext = type->GetScriptContext();
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(JavascriptNativeIntArray::GetItemQuery(this, index, outVal, requestContext)))
        {
            return TRUE;
        }

        return JavascriptOperators::GetItem(this, this->GetPrototype(), index, outVal, requestContext);
    }